

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  QPointF args_3_00;
  QPointF args_2_00;
  uint uVar1;
  ulong uVar2;
  QFlags<Qt::MouseButton> in_ECX;
  TabletEvent *in_RDX;
  unsigned_long in_RSI;
  QWindow *in_RDI;
  int in_R8D;
  QFlags<Qt::KeyboardModifier> in_R9D;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  qreal in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  QWindow *in_XMM4_Qa;
  double in_XMM5_Qa;
  QPointF *in_XMM6_Qa;
  QPointF *in_XMM7_Qa;
  undefined8 in_stack_00000008;
  TabletEvent event;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  qreal in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec0;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> flags;
  bool local_fd;
  int in_stack_ffffffffffffff18;
  undefined1 local_a0 [16];
  byte local_90;
  long local_8;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QThread::isMainThread();
  if ((uVar2 & 1) == 0) {
    args_2_00.yp = in_XMM1_Qa;
    args_2_00.xp = in_XMM0_Qa;
    args_3_00.yp._0_4_ = (int)in_XMM3_Qa;
    args_3_00.xp = in_XMM2_Qa;
    args_3_00.yp._4_4_ = (int)((ulong)in_XMM3_Qa >> 0x20);
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
              (in_RDI,in_RSI,args_2_00,args_3_00,(QPointingDevice *)in_RDX,in_ECX,(double)in_XMM4_Qa
               ,in_XMM5_Qa,(double)in_XMM6_Qa,(double)in_XMM7_Qa,in_XMM2_Qa,in_R8D,in_R9D);
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_00000008._4_4_
              );
    local_fd = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)flags.i);
    goto LAB_0044f76d;
  }
  memcpy(local_a0,&DAT_00ba3e20,0x98);
  QWindowSystemInterfacePrivate::TabletEvent::TabletEvent
            (in_RDX,in_XMM4_Qa,(ulong)in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,
             (QPointingDevice *)CONCAT44(in_R8D,in_stack_fffffffffffffec0),
             (QFlagsStorageHelper<Qt::MouseButton,_4>)SUB84((ulong)in_RDI >> 0x20,0),
             (qreal)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0,
             (qreal)CONCAT44(in_stack_fffffffffffffeac,
                             in_R9D.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                             super_QFlagsStorage<Qt::KeyboardModifier>.i),
             (qreal)CONCAT44(in_stack_fffffffffffffea4,in_R8D),
             (qreal)CONCAT44(uVar3,in_ECX.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                   super_QFlagsStorage<Qt::MouseButton>.i),in_stack_ffffffffffffff18
             ,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(in_RDI,0));
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              ((WindowSystemEvent *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
LAB_0044f66d:
    local_fd = (bool)(local_90 & 1);
  }
  else {
    uVar1 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_a0);
    if ((uVar1 & 1) != 0) goto LAB_0044f66d;
    local_fd = false;
  }
  QWindowSystemInterfacePrivate::TabletEvent::~TabletEvent((TabletEvent *)0x44f68f);
LAB_0044f76d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_fd;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}